

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsPort.cpp
# Opt level: O0

long __thiscall AmsPort::DelNotification(AmsPort *this,AmsAddr ams,uint32_t hNotify)

{
  bool bVar1;
  pointer ppVar2;
  element_type *this_00;
  AmsAddr AVar3;
  long status;
  pair<const_AmsAddr,_const_unsigned_int> local_44;
  _Self local_38;
  iterator it;
  lock_guard<std::mutex> lock;
  uint32_t hNotify_local;
  AmsPort *this_local;
  AmsAddr ams_local;
  
  lock._M_device._4_4_ = hNotify;
  this_local = (AmsPort *)ams;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&it,&this->mutex);
  std::pair<const_AmsAddr,_const_unsigned_int>::pair<unsigned_int_&,_true>
            (&local_44,(AmsAddr *)&this_local,(uint *)((long)&lock._M_device + 4));
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::pair<const_AmsAddr,_const_unsigned_int>,_std::shared_ptr<NotificationDispatcher>,_std::less<std::pair<const_AmsAddr,_const_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<const_AmsAddr,_const_unsigned_int>,_std::shared_ptr<NotificationDispatcher>_>_>_>
       ::find(&this->dispatcherList,&local_44);
  status = (long)std::
                 map<std::pair<const_AmsAddr,_const_unsigned_int>,_std::shared_ptr<NotificationDispatcher>,_std::less<std::pair<const_AmsAddr,_const_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<const_AmsAddr,_const_unsigned_int>,_std::shared_ptr<NotificationDispatcher>_>_>_>
                 ::end(&this->dispatcherList);
  bVar1 = std::operator!=(&local_38,(_Self *)&status);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::pair<const_AmsAddr,_const_unsigned_int>,_std::shared_ptr<NotificationDispatcher>_>_>
             ::operator->(&local_38);
    this_00 = std::
              __shared_ptr_access<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ppVar2->second);
    AVar3 = (AmsAddr)NotificationDispatcher::Erase(this_00,lock._M_device._4_4_,this->tmms);
    std::
    map<std::pair<AmsAddr_const,unsigned_int_const>,std::shared_ptr<NotificationDispatcher>,std::less<std::pair<AmsAddr_const,unsigned_int_const>>,std::allocator<std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>>>
    ::erase_abi_cxx11_((map<std::pair<AmsAddr_const,unsigned_int_const>,std::shared_ptr<NotificationDispatcher>,std::less<std::pair<AmsAddr_const,unsigned_int_const>>,std::allocator<std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>>>
                        *)&this->dispatcherList,(iterator)local_38._M_node);
    ams_local = AVar3;
  }
  else {
    ams_local.netId.b[0] = 'R';
    ams_local.netId.b[1] = '\a';
    ams_local.netId.b[2] = '\0';
    ams_local.netId.b[3] = '\0';
    ams_local.netId.b[4] = '\0';
    ams_local.netId.b[5] = '\0';
    ams_local.port = 0;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it);
  return (long)ams_local;
}

Assistant:

long AmsPort::DelNotification(const AmsAddr ams, uint32_t hNotify)
{
    std::lock_guard<std::mutex> lock(mutex);
    auto it = dispatcherList.find({ams, hNotify});
    if (it != dispatcherList.end()) {
        const auto status = it->second->Erase(hNotify, tmms);
        dispatcherList.erase(it);
        return status;
    }
    return ADSERR_CLIENT_REMOVEHASH;
}